

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::generateRandom3D3DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *points1,bearingVectors_t *points2,MatrixXd *gt)

{
  pointer *ppMVar1;
  double *pdVar2;
  pointer pMVar3;
  double dVar4;
  ulong uVar5;
  double *pdVar6;
  iterator iVar7;
  pointer pMVar8;
  pointer pMVar9;
  pointer pMVar10;
  double dVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *pvVar17;
  void *pvVar18;
  undefined8 *puVar19;
  ulong uVar20;
  long lVar21;
  PointerType ptr_1;
  SrcEvaluatorType srcEvaluator;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 in_ZMM2 [64];
  PointerType ptr;
  Vector3d local_88;
  double adStack_70 [2];
  ulong local_60;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *local_58;
  double local_50 [2];
  long local_40;
  rotation_t *local_38;
  
  auVar31 = in_ZMM2._0_16_;
  adStack_70[1] = noise;
  local_58 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)points1;
  local_50[0] = (double)numberPoints;
  local_50[1] = outlierFraction;
  local_38 = rotation1;
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar27 = 0;
    uVar25 = 0;
    do {
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      generateRandomPoint(&local_88,8.0,4.0);
      auVar31 = in_ZMM2._0_16_;
      uVar5 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      pdVar6 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar22 = uVar5;
      if ((((ulong)(pdVar6 + uVar5 * uVar25) & 7) == 0) &&
         (uVar22 = (ulong)(-((uint)((ulong)(pdVar6 + uVar5 * uVar25) >> 3) & 0x1fffffff) & 7),
         (long)uVar5 <= (long)uVar22)) {
        uVar22 = uVar5;
      }
      uVar23 = uVar5 - uVar22;
      uVar20 = uVar23 + 7;
      if (-1 < (long)uVar23) {
        uVar20 = uVar23;
      }
      if (0 < (long)uVar22) {
        uVar24 = 0;
        do {
          *(double *)((long)pdVar6 + uVar24 * 8 + uVar5 * lVar27) =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar22 != uVar24);
      }
      uVar20 = (uVar20 & 0xfffffffffffffff8) + uVar22;
      if (7 < (long)uVar23) {
        do {
          dVar4 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[uVar22 + 1];
          dVar11 = adStack_70[uVar22 - 1];
          dVar13 = adStack_70[uVar22];
          dVar14 = adStack_70[uVar22 + 1];
          dVar15 = adStack_70[uVar22 + 2];
          pvVar17 = (&local_58)[uVar22];
          dVar16 = local_50[uVar22];
          pdVar2 = (double *)((long)pdVar6 + uVar22 * 8 + uVar5 * lVar27);
          *pdVar2 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[uVar22];
          pdVar2[1] = dVar4;
          pdVar2[2] = dVar11;
          pdVar2[3] = dVar13;
          pdVar2[4] = dVar14;
          pdVar2[5] = dVar15;
          pdVar2[6] = (double)pvVar17;
          pdVar2[7] = dVar16;
          uVar22 = uVar22 + 8;
        } while ((long)uVar22 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar5) {
        do {
          *(double *)((long)pdVar6 + uVar20 * 8 + uVar5 * lVar27) =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar5 != uVar20);
      }
      uVar5 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      uVar25 = uVar25 + 1;
      lVar27 = lVar27 + 8;
    } while (uVar25 < uVar5);
    if (uVar5 != 0) {
      lVar27 = 0;
      local_60 = 0;
      do {
        pdVar6 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar26 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        pvVar18 = malloc(0x58);
        if (pvVar18 == (void *)0x0) {
LAB_0025e238:
          puVar19 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar19 = operator_delete;
          __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar25 = (ulong)pvVar18 & 0xffffffffffffffc0;
        lVar21 = 0;
        *(void **)(uVar25 + 0x38) = pvVar18;
        do {
          *(double *)(uVar25 + 0x40 + lVar21 * 8) =
               *(double *)((long)pdVar6 + lVar21 * 8 + lVar26 * lVar27) -
               (position1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[lVar21];
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[0] * *(double *)(uVar25 + 0x40) +
              (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[1] * *(double *)(uVar25 + 0x48) +
              (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[2] * *(double *)(uVar25 + 0x50);
        local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[3] * *(double *)(uVar25 + 0x40) +
              (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[4] * *(double *)(uVar25 + 0x48) +
              (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[5] * *(double *)(uVar25 + 0x50);
        local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[6] * *(double *)(uVar25 + 0x40) +
              (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[7] * *(double *)(uVar25 + 0x48) +
              (local_38->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[8] * *(double *)(uVar25 + 0x50);
        free(pvVar18);
        iVar7._M_current = *(Matrix<double,_3,_1,_0,_3,_1> **)(local_58 + 8);
        if (iVar7._M_current == *(Matrix<double,_3,_1,_0,_3,_1> **)(local_58 + 0x10)) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>(local_58,iVar7,&local_88);
        }
        else {
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          *(long *)(local_58 + 8) = *(long *)(local_58 + 8) + 0x18;
        }
        pdVar6 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar26 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
        pvVar18 = malloc(0x58);
        if (pvVar18 == (void *)0x0) goto LAB_0025e238;
        uVar25 = (ulong)pvVar18 & 0xffffffffffffffc0;
        lVar21 = 0;
        *(void **)(uVar25 + 0x38) = pvVar18;
        do {
          *(double *)(uVar25 + 0x40 + lVar21 * 8) =
               *(double *)((long)pdVar6 + lVar21 * 8 + lVar26 * lVar27) -
               (position2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[lVar21];
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[0] * *(double *)(uVar25 + 0x40) +
              (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[1] * *(double *)(uVar25 + 0x48) +
              (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[2] * *(double *)(uVar25 + 0x50);
        local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [1] = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[3] * *(double *)(uVar25 + 0x40) +
              (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[4] * *(double *)(uVar25 + 0x48) +
              (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[5] * *(double *)(uVar25 + 0x50);
        local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2] = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[6] * *(double *)(uVar25 + 0x40) +
              (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[7] * *(double *)(uVar25 + 0x48) +
              (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[8] * *(double *)(uVar25 + 0x50);
        free(pvVar18);
        iVar7._M_current =
             (points2->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (points2->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)points2,iVar7,&local_88);
        }
        else {
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          ppMVar1 = &(points2->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        pvVar17 = local_58;
        uVar25 = local_60;
        if (0.0 < adStack_70[1]) {
          lVar26 = *(long *)local_58;
          lVar12 = local_60 * 0x18;
          local_40 = lVar27;
          generateRandomTranslation(&local_88,adStack_70[1]);
          lVar27 = local_40;
          pdVar6 = (double *)(lVar26 + lVar12);
          dVar4 = pdVar6[1];
          lVar21 = *(long *)pvVar17;
          pdVar2 = (double *)(lVar21 + lVar12);
          *pdVar2 = *pdVar6 + local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[0];
          pdVar2[1] = dVar4 + local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[1];
          *(double *)(lVar21 + 0x10 + lVar12) =
               *(double *)(lVar26 + 0x10 + lVar12) +
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          pMVar8 = (points2->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          generateRandomTranslation(&local_88,adStack_70[1]);
          pMVar10 = pMVar8 + uVar25;
          dVar4 = *(double *)
                   ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data + 8);
          pMVar9 = (points2->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pMVar3 = pMVar9 + uVar25;
          (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0] = (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0] +
                     local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0];
          *(double *)
           ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data + 8) =
               dVar4 + local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1];
          *(double *)
           ((long)&pMVar9[uVar25].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data + 0x10) =
               *(double *)
                ((long)&pMVar8[uVar25].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + 0x10) +
               local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
        }
        auVar31 = in_ZMM2._0_16_;
        lVar27 = lVar27 + 8;
        local_60 = local_60 + 1;
      } while (local_60 <
               (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols);
    }
  }
  auVar31 = vcvtusi2sd_avx512f(auVar31,local_50[0]);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar31._0_8_ * local_50[1];
  auVar31 = vroundsd_avx(auVar29,auVar29,9);
  lVar27 = vcvttsd2usi_avx512f(auVar31);
  if (lVar27 != 0) {
    lVar26 = 0x10;
    do {
      generateRandomPoint(&local_88,8.0,4.0);
      auVar31._8_8_ =
           local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      auVar31._0_8_ =
           local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      pMVar10 = (points2->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      dVar11 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] -
               (position2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
      auVar29 = vsubpd_avx(auVar31,*(undefined1 (*) [16])
                                    (position2->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array);
      auVar31 = vmovhpd_avx(*(undefined1 (*) [16])
                             ((rotation2->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array + 2),
                            (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                            ).m_storage.m_data.array[5]);
      dVar28 = auVar29._0_8_;
      dVar30 = auVar29._8_8_;
      dVar13 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
      dVar14 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
      dVar15 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
      dVar16 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
      dVar4 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[8];
      pdVar6 = (double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar26 + -0x10);
      *pdVar6 = dVar11 * auVar31._0_8_ +
                dVar28 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[0] +
                dVar30 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[1];
      pdVar6[1] = dVar11 * auVar31._8_8_ + dVar28 * dVar13 + dVar30 * dVar14;
      *(double *)
       ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar26) = dVar11 * dVar4 + dVar28 * dVar15 + dVar30 * dVar16;
      lVar26 = lVar26 + 0x18;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
  }
  return;
}

Assistant:

void
opengv::generateRandom3D3DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & points1,
    bearingVectors_t & points2,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 3D-3D correspondences
  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //transform the points into the frames and store
    points1.push_back(rotation1.transpose()*(gt.col(i) - position1));
    points2.push_back(rotation2.transpose()*(gt.col(i) - position2));

    //add noise
    if( noise > 0.0 )
    {
      points1[i] = points1[i] + generateRandomTranslation(noise);
      points2[i] = points2[i] + generateRandomTranslation(noise);
    }
  }

  //add outliers
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //generate a random point
    point_t p = generateRandomPoint(8,4);

    //push-back in frame 2 only to create outlier
    points2[i] = rotation2.transpose()*(p - position2);
  }
}